

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O1

bool __thiscall SQArray::Get(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  bool bVar5;
  SQObjectType SVar6;
  SQObjectValue *pSVar7;
  
  bVar5 = nidx < (long)(this->_values)._size;
  if (bVar5 && -1 < nidx) {
    pSVar2 = (this->_values)._vals + nidx;
    pSVar7 = &(pSVar2->super_SQObject)._unVal;
    SVar6 = (pSVar2->super_SQObject)._type;
    if (SVar6 == OT_WEAKREF) {
      SVar6 = (pSVar7->pWeakRef->_obj)._type;
      pSVar7 = &(pSVar7->pWeakRef->_obj)._unVal;
    }
    SVar3 = (val->super_SQObject)._type;
    pSVar4 = (val->super_SQObject)._unVal.pTable;
    (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)*(SQWeakRef **)pSVar7;
    (val->super_SQObject)._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar1 = &(((val->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar5 && -1 < nidx;
}

Assistant:

bool Get(const SQInteger nidx,SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            SQObjectPtr &o = _values[nidx];
            val = _realval(o);
            return true;
        }
        else return false;
    }